

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinefieldAppearance.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::MinefieldAppearance::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,MinefieldAppearance *this)

{
  ostream *poVar1;
  KINT32 Value;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  MinefieldAppearance *local_18;
  MinefieldAppearance *this_local;
  
  local_18 = this;
  this_local = (MinefieldAppearance *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"MinefieldAppearance:");
  poVar1 = std::operator<<(poVar1,"\n\tMinefield Type:           ");
  ENUMS::GetEnumAsStringMinefieldType_abi_cxx11_
            (&local_1d0,(ENUMS *)(ulong)((this->m_ui16BitUnion).m_ui16App & 3),Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  poVar1 = std::operator<<(poVar1,"\n\tActive Status(0 = true):  ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->m_ui16BitUnion).m_ui16App >> 2 & 1);
  poVar1 = std::operator<<(poVar1,"\n\tActive Lane(0 = true):    ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->m_ui16BitUnion).m_ui16App >> 3 & 1);
  poVar1 = std::operator<<(poVar1,"\n\tState(0 = true):          ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->m_ui16BitUnion).m_ui16App >> 0xd & 1);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString MinefieldAppearance::GetAsString() const
{
    KStringStream ss;

    ss << "MinefieldAppearance:"
       << "\n\tMinefield Type:           " << GetEnumAsStringMinefieldType( m_ui16BitUnion.m_ui16Type )
       << "\n\tActive Status(0 = true):  " << m_ui16BitUnion.m_ui16ActiveStatus
       << "\n\tActive Lane(0 = true):    " << m_ui16BitUnion.m_ui16Lane
       << "\n\tState(0 = true):          " << m_ui16BitUnion.m_ui16State
       << "\n";

    return ss.str();
}